

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

BinaryOperator * __thiscall
soul::PoolAllocator::
allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
          (PoolAllocator *this,CodeLocation *args,Expression *args_1,Expression *args_2,Op *args_3)

{
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_5d [13];
  CodeLocation local_50;
  BinaryOperator *local_40;
  BinaryOperator *newObject;
  PoolItem *newItem;
  Op *args_local_3;
  Expression *args_local_2;
  Expression *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (Op *)args_2;
  args_local_2 = args_1;
  args_local_1 = (Expression *)args;
  args_local = (CodeLocation *)this;
  newObject = (BinaryOperator *)allocateSpaceForObject(this,0x48);
  this_00 = &(newObject->super_Expression).super_Object.location.location;
  CodeLocation::CodeLocation(&local_50,(CodeLocation *)args_local_1);
  heart::BinaryOperator::BinaryOperator
            ((BinaryOperator *)this_00,&local_50,args_local_2,(Expression *)args_local_3,
             (Op)newItem->size);
  CodeLocation::~CodeLocation(&local_50);
  local_40 = (BinaryOperator *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation&&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_5d);
  (newObject->super_Expression).super_Object.location.sourceCode.object = pSVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }